

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O3

void __thiscall
cmIncludeDirectoryCommand::NormalizeInclude(cmIncludeDirectoryCommand *this,string *inc)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  string *psVar6;
  string tmp;
  long *local_40 [2];
  long local_30 [2];
  
  uVar4 = std::__cxx11::string::find_first_not_of((char *)inc,0x5b34e8,0);
  lVar5 = std::__cxx11::string::find_last_not_of((char *)inc,0x5b34e8,0xffffffffffffffff);
  if (lVar5 == -1 || uVar4 == 0xffffffffffffffff) {
    inc->_M_string_length = 0;
    *(inc->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar4);
    bVar3 = cmSystemTools::IsOff(inc);
    if (!bVar3) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      bVar3 = cmsys::SystemTools::FileIsFullPath(inc);
      if ((!bVar3) &&
         (((inc->_M_string_length < 2 || (pcVar1 = (inc->_M_dataplus)._M_p, *pcVar1 != '$')) ||
          (pcVar1[1] != '<')))) {
        psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        pcVar2 = (psVar6->_M_dataplus)._M_p;
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_40,pcVar2,pcVar2 + psVar6->_M_string_length);
        std::__cxx11::string::append((char *)local_40);
        std::__cxx11::string::_M_append((char *)local_40,(ulong)(inc->_M_dataplus)._M_p);
        std::__cxx11::string::_M_assign((string *)inc);
        if (local_40[0] != local_30) {
          operator_delete(local_40[0],local_30[0] + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void cmIncludeDirectoryCommand::NormalizeInclude(std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc.clear();
    return;
  }

  if (!cmSystemTools::IsOff(inc)) {
    cmSystemTools::ConvertToUnixSlashes(inc);

    if (!cmSystemTools::FileIsFullPath(inc)) {
      if (!cmGeneratorExpression::StartsWithGeneratorExpression(inc)) {
        std::string tmp = this->Makefile->GetCurrentSourceDirectory();
        tmp += "/";
        tmp += inc;
        inc = tmp;
      }
    }
  }
}